

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_quilt(REF_GEOM ref_geom,REF_INT auto_tparams,REF_DBL *global_params)

{
  printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_quilt");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_quilt(REF_GEOM ref_geom, REF_INT auto_tparams,
                                   REF_DBL *global_params) {
#if defined(HAVE_EGADS) && !defined(HAVE_EGADS_LITE) && \
    defined(HAVE_EGADS_EFFECTIVE)
  ego effective[2];
  ego tess, model;
  double angle;
  REF_BOOL quilt_on_angle = REF_FALSE;

  RAS(ref_geom_model_loaded(ref_geom), "load model before quilting");
  RAS(!ref_geom_effective(ref_geom), "already effective, quilting twice?");

  REIS(EGADS_SUCCESS,
       EG_copyObject((ego)(ref_geom->body), NULL, &(effective[0])),
       "copy body");

  /* need to use copy to build tess so they match */
  ref_geom->body = effective[0];
  RSS(ref_egads_free_body_objects(ref_geom), "free before new cache");
  RSS(ref_egads_cache_body_objects(ref_geom), "cache egads objects");
  RSS(ref_egads_tess_create(ref_geom, &tess, auto_tparams, global_params),
      "create tess object");

  angle = 10.0;
  REIS(EGADS_SUCCESS, EG_initEBody(tess, angle, &effective[1]), "init xEB");

  RSS(ref_egads_quilt_attributes(effective[0], effective[1]), "quilt attr");

  if (quilt_on_angle) {
    REF_INT *e2f;
    RSS(ref_egads_edge_faces(ref_geom, &e2f), "edge2face");
    RSS(ref_egads_quilt_angle(ref_geom, effective[0], effective[1], angle, e2f),
        "quilt attr");
    ref_free(e2f);
  }

  REIS(EGADS_SUCCESS, EG_finishEBody(effective[1]), "complete EB");
  REIS(0, EG_deleteObject(tess), "delete tess copied into ebody");

  REIS(0, EG_deleteObject((ego)(ref_geom->model)), "delete body model");
  REIS(EGADS_SUCCESS,
       EG_makeTopology((ego)(ref_geom->context), NULL, MODEL, 2, NULL, 1,
                       effective, NULL, &model),
       "make Topo Model");
  ref_geom->model = (void *)model;

  ref_geom->body = (void *)effective[1];
  ref_geom_effective(ref_geom) = REF_TRUE;

  RSS(ref_egads_free_body_objects(ref_geom), "free before new cache");
  RSS(ref_egads_cache_body_objects(ref_geom), "cache egads objects");

  return REF_SUCCESS;
#else
  printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(auto_tparams);
  SUPRESS_UNUSED_COMPILER_WARNING(global_params);
  return REF_SUCCESS;
#endif
}